

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpattern.cc
# Opt level: O0

bool __thiscall PatternBlock::isInstructionMatch(PatternBlock *this,ParserWalker *walker)

{
  uint uVar1;
  uintm uVar2;
  size_type sVar3;
  const_reference pvVar4;
  int local_28;
  uintm data;
  int4 i;
  int4 off;
  ParserWalker *walker_local;
  PatternBlock *this_local;
  
  if (this->nonzerosize < 1) {
    this_local._7_1_ = this->nonzerosize == 0;
  }
  else {
    data = this->offset;
    for (local_28 = 0;
        sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->maskvec),
        (ulong)(long)local_28 < sVar3; local_28 = local_28 + 1) {
      uVar2 = ParserWalker::getInstructionBytes(walker,data,4);
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->maskvec,(long)local_28);
      uVar1 = *pvVar4;
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->valvec,(long)local_28);
      if ((uVar1 & uVar2) != *pvVar4) {
        return false;
      }
      data = data + 4;
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool PatternBlock::isInstructionMatch(ParserWalker &walker) const

{
  if (nonzerosize<=0) return (nonzerosize==0);
  int4 off = offset;
  for(int4 i=0;i<maskvec.size();++i) {
    uintm data = walker.getInstructionBytes(off,sizeof(uintm));
    if ((maskvec[i] & data)!=valvec[i]) return false;
    off += sizeof(uintm);
  }
  return true;
}